

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
~ParticleArrayTest_Assignment_Test
          (ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}